

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O1

int64_t __thiscall
r_comp::RepliStruct::parse
          (RepliStruct *this,istream *stream,uint64_t *curIndent,uint64_t *prevIndent,
          int64_t paramExpect)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  RepliStruct *pRVar2;
  int64_t iVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  uint64_t uVar8;
  char cVar9;
  char cVar10;
  RepliStruct *this_00;
  string *psVar11;
  long lVar12;
  long lVar13;
  shared_ptr<r_comp::RepliStruct> subStruct;
  string str;
  string label;
  undefined1 local_dd;
  Type local_dc;
  RepliStruct *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  value_type local_c8;
  RepliStruct *local_b0;
  long local_a8;
  vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  *local_a0;
  int64_t local_98;
  uint local_8c;
  ulong *local_88;
  ulong *local_80;
  char *local_78;
  char *local_70;
  char local_68 [16];
  string *local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 local_40 [16];
  
  local_78 = local_68;
  lVar12 = 0;
  local_70 = (char *)0x0;
  local_68[0] = '\0';
  local_50 = local_40;
  local_48 = (char *)0x0;
  local_40[0] = 0;
  local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (RepliStruct *)0x0;
  local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = (string *)&this->cmd;
  local_a0 = &this->args;
  local_a8 = 0;
  local_8c = 0;
  local_b0 = this;
  local_98 = paramExpect;
  local_88 = curIndent;
  local_80 = prevIndent;
  cVar9 = '\0';
LAB_0011e732:
  while( true ) {
    lVar13 = 0;
    if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) != 0) goto LAB_0011f884;
    this_00 = (RepliStruct *)stream;
    cVar4 = std::istream::get();
    pRVar2 = local_b0;
    lVar13 = lVar12;
    if (cVar4 != '[') break;
    if (cVar9 == ':') {
      std::__cxx11::string::_M_assign((string *)&local_50);
      std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x13f2b0);
    }
    iVar6 = std::istream::peek();
    if (iVar6 == 0x5d) {
      std::istream::get();
      iVar6 = std::istream::peek();
      iVar6 = iVar6 * 0x1000000;
      if ((iVar6 < 0x20000000) || (iVar6 == 0x3b000000)) {
        local_8c = (uint)CONCAT71((uint7)(uint3)((uint)iVar6 >> 8),1);
        cVar9 = cVar4;
      }
      else if ((cVar9 == ':') || (cVar9 < '!')) {
        local_dc = Set;
        local_d8 = (RepliStruct *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
                  (&_Stack_d0,&local_d8,(allocator<r_comp::RepliStruct> *)&local_dd,&local_dc);
        _Var1._M_pi = local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_d0._M_pi;
        local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_d8;
        local_d8 = (RepliStruct *)0x0;
        _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
        }
        if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
        }
        (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        parent = local_b0;
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->label);
        std::
        vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
        ::push_back(local_a0,&local_c8);
        cVar9 = cVar4;
      }
      else {
        std::__cxx11::string::append((char *)&local_78);
        cVar9 = cVar4;
      }
    }
    else {
      if (local_70 != (char *)0x0) {
        if (((local_b0->cmd)._M_string_length == 0) && (local_b0->type != Set)) {
          std::__cxx11::string::_M_assign(local_58);
          std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x13f2b0);
        }
        else {
          local_dc = Atom;
          local_d8 = (RepliStruct *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
                    (&_Stack_d0,&local_d8,(allocator<r_comp::RepliStruct> *)&local_dd,&local_dc);
          _Var1._M_pi = local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Stack_d0._M_pi;
          local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_d8;
          local_d8 = (RepliStruct *)0x0;
          _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
          }
          if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
          }
          (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          parent = local_b0;
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(local_a0,&local_c8);
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->cmd);
          std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x13f2b0);
          if ((0 < local_98) && (local_a8 = local_a8 + 1, local_a8 == local_98)) goto LAB_0011f884;
        }
      }
      local_dc = Set;
      local_d8 = (RepliStruct *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
                (&_Stack_d0,&local_d8,(allocator<r_comp::RepliStruct> *)&local_dd,&local_dc);
      _Var1._M_pi = local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Stack_d0._M_pi;
      local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8
      ;
      local_d8 = (RepliStruct *)0x0;
      _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
      }
      if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
      }
      (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->parent
           = local_b0;
      std::__cxx11::string::_M_assign
                ((string *)
                 &(local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->label);
      std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x13f2b0);
      std::
      vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
      ::push_back(local_a0,&local_c8);
      lVar7 = parse(local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,stream,local_88,local_80,0);
LAB_0011ef8c:
      if (lVar7 < 0) goto LAB_0011f756;
      if ((0 < local_98) && (local_a8 = local_a8 + 1, lVar13 = 0, local_a8 == local_98))
      goto LAB_0011f884;
LAB_0011f443:
      cVar9 = cVar4;
      if (lVar7 != 0) {
        lVar13 = lVar7 + -1;
        goto LAB_0011f884;
      }
    }
  }
  iVar6 = (int)cVar4;
  cVar10 = (char)&local_78;
  if (iVar6 < 0x3b) {
    if (iVar6 < 0x20) {
      if (iVar6 == 9) {
        local_b0->line = GlobalLine;
LAB_0011f56b:
        std::__cxx11::string::append((char *)&local_b0->error);
        lVar13 = -1;
        goto LAB_0011f884;
      }
      if (iVar6 == 10) goto LAB_0011f158;
      if (iVar6 != 0xd) goto switchD_0011e81f_caseD_22;
      while ((((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0 &&
             (this_00 = (RepliStruct *)stream, iVar6 = std::istream::peek(), iVar6 < 0x20))) {
        this_00 = (RepliStruct *)stream;
        iVar6 = std::istream::get();
        if (iVar6 == 10) {
LAB_0011f158:
          GlobalLine = GlobalLine + 1;
        }
      }
      *local_80 = *local_88;
      uVar8 = getIndent(this_00,stream);
      iVar3 = local_98;
      pRVar2 = local_b0;
      *local_88 = uVar8;
      if (*local_80 < uVar8) {
        if ((local_8c & 1) == 0) {
          local_dc = Structure;
          local_d8 = (RepliStruct *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
                    (&_Stack_d0,&local_d8,(allocator<r_comp::RepliStruct> *)&local_dd,&local_dc);
          _Var1._M_pi = local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Stack_d0._M_pi;
          local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_d8;
          local_d8 = (RepliStruct *)0x0;
          _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
          }
          if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
          }
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(local_a0,&local_c8);
          lVar7 = parse(local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,stream,local_88,local_80,0);
        }
        else {
          local_dc = Set;
          local_d8 = (RepliStruct *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
                    (&_Stack_d0,&local_d8,(allocator<r_comp::RepliStruct> *)&local_dd,&local_dc);
          _Var1._M_pi = local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Stack_d0._M_pi;
          local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_d8;
          local_d8 = (RepliStruct *)0x0;
          _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
          }
          if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
          }
          (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          parent = local_b0;
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->label);
          std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x13f2b0);
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(local_a0,&local_c8);
          lVar7 = parse(local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,stream,local_88,local_80,0);
        }
        if (-1 < lVar7) {
          if ((local_98 < 1) || (local_a8 = local_a8 + 1, local_a8 != local_98)) {
            local_8c = 0;
            goto LAB_0011f443;
          }
          goto LAB_0011f884;
        }
        goto LAB_0011f756;
      }
      if (uVar8 < *local_80) {
        if (local_70 != (char *)0x0) {
          if (((local_b0->cmd)._M_string_length == 0) && (local_b0->type != Set)) {
            std::__cxx11::string::_M_assign((string *)&local_b0->cmd);
            std::__cxx11::string::operator=((string *)&local_78,"");
          }
          else {
            local_dc = Atom;
            local_d8 = (RepliStruct *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
                      (&_Stack_d0,&local_d8,(allocator<r_comp::RepliStruct> *)&local_dd,&local_dc);
            _Var1._M_pi = local_c8.
                          super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = _Stack_d0._M_pi;
            local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_d8;
            local_d8 = (RepliStruct *)0x0;
            _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
            }
            if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
            }
            (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            parent = pRVar2;
            std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::push_back(local_a0,&local_c8);
            std::__cxx11::string::_M_assign
                      ((string *)
                       &(local_c8.
                         super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->cmd);
            std::__cxx11::string::operator=((string *)&local_78,"");
            if ((0 < iVar3) && (local_a8 + 1 == iVar3)) goto LAB_0011f881;
          }
        }
        lVar13 = ~*local_88 + *local_80;
        goto LAB_0011f884;
      }
      cVar9 = cVar4;
      if (local_70 != (char *)0x0) {
        if (((local_b0->cmd)._M_string_length != 0) || ((local_b0->type & ~Set) == Root)) {
          local_dc = Atom;
          local_d8 = (RepliStruct *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
                    (&_Stack_d0,&local_d8,(allocator<r_comp::RepliStruct> *)&local_dd,&local_dc);
          _Var1._M_pi = local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Stack_d0._M_pi;
          local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_d8;
          local_d8 = (RepliStruct *)0x0;
          _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
          }
          if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
          }
          (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          parent = local_b0;
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(local_a0,&local_c8);
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->cmd);
          std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x13f2b0);
          goto LAB_0011f366;
        }
        goto LAB_0011f451;
      }
    }
    else {
      switch(iVar6) {
      case 0x20:
        cVar9 = cVar4;
        if (local_70 != (char *)0x0) {
          if (((local_b0->cmd)._M_string_length == 0) &&
             ((local_b0->type | Directive) != Development)) {
LAB_0011f451:
            std::__cxx11::string::_M_assign(local_58);
            std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x13f2b0);
            cVar9 = cVar4;
          }
          else {
            if ((*local_78 == '\"') && ((local_78 + -1)[(long)local_70] != '\"')) {
              std::__cxx11::string::push_back(cVar10);
              do {
                if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) != 0) break;
                cVar4 = std::istream::get();
                std::__cxx11::string::push_back(cVar10);
              } while (cVar4 != '\"');
            }
            local_dc = Atom;
            local_d8 = (RepliStruct *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
                      (&_Stack_d0,&local_d8,(allocator<r_comp::RepliStruct> *)&local_dd,&local_dc);
            _Var1._M_pi = local_c8.
                          super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = _Stack_d0._M_pi;
            local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_d8;
            local_d8 = (RepliStruct *)0x0;
            _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
            }
            if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
            }
            (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            parent = local_b0;
            std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::push_back(local_a0,&local_c8);
            std::__cxx11::string::_M_assign
                      ((string *)
                       &(local_c8.
                         super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->cmd);
            std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x13f2b0);
LAB_0011f366:
            cVar9 = cVar4;
            if ((0 < local_98) && (local_a8 = local_a8 + 1, local_a8 == local_98))
            goto LAB_0011f884;
          }
        }
        break;
      case 0x21:
        if (local_b0->type != Root) goto LAB_0011f56b;
        local_dc = Directive;
        local_d8 = (RepliStruct *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
                  (&_Stack_d0,&local_d8,(allocator<r_comp::RepliStruct> *)&local_dd,&local_dc);
        _Var1._M_pi = local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_d0._M_pi;
        local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_d8;
        local_d8 = (RepliStruct *)0x0;
        _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
        }
        if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
        }
        (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        parent = local_b0;
        std::
        vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
        ::push_back(local_a0,&local_c8);
        bVar5 = parseDirective(local_c8.
                               super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,stream,local_88,local_80);
        cVar9 = cVar4;
        if (!bVar5) {
LAB_0011f756:
          lVar13 = -1;
LAB_0011f884:
          if (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_50 != local_40) {
            operator_delete(local_50);
          }
          if (local_78 != local_68) {
            operator_delete(local_78);
          }
          return lVar13;
        }
        break;
      default:
        goto switchD_0011e81f_caseD_22;
      case 0x28:
        if (local_70 != (char *)0x0) {
          psVar11 = (string *)&local_50;
          if ((cVar9 == ':') ||
             (((local_b0->cmd)._M_string_length == 0 && (psVar11 = local_58, local_b0->type != Set))
             )) {
            std::__cxx11::string::_M_assign(psVar11);
            std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x13f2b0);
          }
          else {
            local_dc = Atom;
            local_d8 = (RepliStruct *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
                      (&_Stack_d0,&local_d8,(allocator<r_comp::RepliStruct> *)&local_dd,&local_dc);
            _Var1._M_pi = local_c8.
                          super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = _Stack_d0._M_pi;
            local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_d8;
            local_d8 = (RepliStruct *)0x0;
            _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
            }
            if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
            }
            (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            parent = local_b0;
            std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::push_back(local_a0,&local_c8);
            std::__cxx11::string::_M_assign
                      ((string *)
                       &(local_c8.
                         super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->cmd);
            std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x13f2b0);
            if ((0 < local_98) && (local_a8 = local_a8 + 1, local_a8 == local_98))
            goto LAB_0011f884;
          }
        }
        local_dc = Structure;
        local_d8 = (RepliStruct *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
                  (&_Stack_d0,&local_d8,(allocator<r_comp::RepliStruct> *)&local_dd,&local_dc);
        _Var1._M_pi = local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_d0._M_pi;
        local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_d8;
        local_d8 = (RepliStruct *)0x0;
        _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
        }
        if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
        }
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->label);
        std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x13f2b0);
        (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        parent = local_b0;
        std::
        vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
        ::push_back(local_a0,&local_c8);
        lVar7 = parse(local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,stream,local_88,local_80,0);
        goto LAB_0011ef8c;
      case 0x29:
        iVar6 = std::istream::peek();
        pRVar2 = local_b0;
        if (iVar6 == 0x3a) {
          cVar9 = (char)local_b0;
          while ((((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0 &&
                 (cVar4 = std::istream::get(), ' ' < cVar4))) {
            std::__cxx11::string::push_back(cVar9 + '(');
          }
        }
        if (local_70 != (char *)0x0) {
          if (((pRVar2->cmd)._M_string_length != 0) || (pRVar2->type == Set)) {
            local_dc = Atom;
            local_d8 = (RepliStruct *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
                      (&_Stack_d0,&local_d8,(allocator<r_comp::RepliStruct> *)&local_dd,&local_dc);
            _Var1._M_pi = local_c8.
                          super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = _Stack_d0._M_pi;
            local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_d8;
            local_d8 = (RepliStruct *)0x0;
            _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
            }
            if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
            }
            (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            parent = pRVar2;
            std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::push_back(local_a0,&local_c8);
LAB_0011f65b:
            local_58 = (string *)
                       &(local_c8.
                         super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->cmd;
          }
LAB_0011f66c:
          std::__cxx11::string::_M_assign(local_58);
          std::__cxx11::string::operator=((string *)&local_78,"");
        }
LAB_0011f881:
        lVar13 = 0;
        goto LAB_0011f884;
      }
    }
    goto LAB_0011e732;
  }
  if (iVar6 < 0x7b) {
    if (iVar6 == 0x3b) {
      while ((cVar9 = cVar4, ((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0 &&
             (iVar6 = std::istream::peek(), iVar6 != 10))) {
        std::istream::get();
      }
      goto LAB_0011e732;
    }
    if (iVar6 == 0x5d) {
      if (local_70 == (char *)0x0) goto LAB_0011f881;
      if (((local_b0->cmd)._M_string_length == 0) && (local_b0->type != Set)) goto LAB_0011f66c;
      local_dc = Atom;
      local_d8 = (RepliStruct *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
                (&_Stack_d0,&local_d8,(allocator<r_comp::RepliStruct> *)&local_dd,&local_dc);
      _Var1._M_pi = local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Stack_d0._M_pi;
      local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8
      ;
      local_d8 = (RepliStruct *)0x0;
      _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
      }
      if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
      }
      (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->parent
           = pRVar2;
      std::
      vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
      ::push_back(local_a0,&local_c8);
      goto LAB_0011f65b;
    }
  }
  else {
    if (iVar6 == 0x7b) {
      if (local_70 != (char *)0x0) {
        psVar11 = (string *)&local_50;
        if ((cVar9 == ':') ||
           (((local_b0->cmd)._M_string_length == 0 && (psVar11 = local_58, local_b0->type != Set))))
        {
          std::__cxx11::string::_M_assign(psVar11);
          std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x13f2b0);
        }
        else {
          local_dc = Atom;
          local_d8 = (RepliStruct *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
                    (&_Stack_d0,&local_d8,(allocator<r_comp::RepliStruct> *)&local_dd,&local_dc);
          _Var1._M_pi = local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Stack_d0._M_pi;
          local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_d8;
          local_d8 = (RepliStruct *)0x0;
          _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
          }
          if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
          }
          (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          parent = local_b0;
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(local_a0,&local_c8);
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->cmd);
          std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x13f2b0);
          if ((0 < local_98) && (local_a8 = local_a8 + 1, local_a8 == local_98)) goto LAB_0011f884;
        }
      }
      local_dc = Development;
      local_d8 = (RepliStruct *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
                (&_Stack_d0,&local_d8,(allocator<r_comp::RepliStruct> *)&local_dd,&local_dc);
      _Var1._M_pi = local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Stack_d0._M_pi;
      local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8
      ;
      local_d8 = (RepliStruct *)0x0;
      _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
      }
      if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
      }
      std::__cxx11::string::_M_assign
                ((string *)
                 &(local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->label);
      std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x13f2b0);
      (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->parent
           = local_b0;
      std::
      vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
      ::push_back(local_a0,&local_c8);
      lVar7 = parse(local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,stream,local_88,local_80,0);
      goto LAB_0011ef8c;
    }
    if (iVar6 == 0x7c) {
      iVar6 = std::istream::peek();
      if (iVar6 == 0x5b) {
        std::istream::get();
        std::istream::get();
        std::__cxx11::string::append((char *)&local_78);
        cVar9 = cVar4;
        goto LAB_0011e732;
      }
    }
    else if (iVar6 == 0x7d) {
      iVar6 = std::istream::peek();
      pRVar2 = local_b0;
      if (iVar6 == 0x3a) {
        cVar9 = (char)local_b0;
        while ((((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0 &&
               (cVar4 = std::istream::get(), ' ' < cVar4))) {
          std::__cxx11::string::push_back(cVar9 + '(');
        }
      }
      if (local_70 != (char *)0x0) {
        if (((pRVar2->cmd)._M_string_length != 0) || ((pRVar2->type | Directive) == Development)) {
          local_dc = Atom;
          local_d8 = (RepliStruct *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
                    (&_Stack_d0,&local_d8,(allocator<r_comp::RepliStruct> *)&local_dd,&local_dc);
          _Var1._M_pi = local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = _Stack_d0._M_pi;
          local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_d8;
          local_d8 = (RepliStruct *)0x0;
          _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
          }
          if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
          }
          (local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          parent = pRVar2;
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(local_a0,&local_c8);
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(local_c8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->cmd);
          std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x13f2b0);
          lVar13 = 0;
          goto LAB_0011f884;
        }
        goto LAB_0011f66c;
      }
      goto LAB_0011f881;
    }
  }
switchD_0011e81f_caseD_22:
  std::__cxx11::string::push_back(cVar10);
  cVar9 = cVar4;
  goto LAB_0011e732;
}

Assistant:

int64_t RepliStruct::parse(std::istream *stream, uint64_t &curIndent, uint64_t &prevIndent, int64_t paramExpect)
{
    char c = 0, lastc = 0, lastcc, tc;
    std::string str, label;
    std::shared_ptr<RepliStruct> subStruct;
    int64_t paramCount = 0;
    int64_t returnIndent = 0;
    bool expectSet = false;

    while (!stream->eof()) {
        lastcc = lastc;
        lastc = c;
        c = stream->get();

        // printf("%c", c);
        switch (c) {
        case '\t':
            line = GlobalLine;
            error += "Tabs chars are not permitted. ";
            return -1;

        case '!':
            if (this->type == Root) {
                subStruct = std::make_shared<RepliStruct>(Directive);
                subStruct->parent = this;
                args.push_back(subStruct);

                if (!subStruct->parseDirective(stream, curIndent, prevIndent)) {
                    return -1;
                }
            } else {
                error += "Directive not allowed inside a structure. ";
                return -1;
            }

            break;

        case '\n':
            GlobalLine++;

        case '\r':

            // skip all CR and LF
            while ((!stream->eof()) && (stream->peek() < 32))
                if (stream->get() == '\n') {
                    GlobalLine++;
                }

            // get indents
            prevIndent = curIndent;
            curIndent = getIndent(stream);

            // Are we in a parenthesis or set
            if (curIndent > prevIndent) {
                // Are we in a set
                if (expectSet) {
                    // Add new sub structure
                    subStruct = std::make_shared<RepliStruct>(Set);
                    subStruct->parent = this;
                    subStruct->label = label;
                    label = "";
                    args.push_back(subStruct);
                    returnIndent = subStruct->parse(stream, curIndent, prevIndent);
                    expectSet = false;

                    if (returnIndent < 0) {
                        return -1;
                    }

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }

                    if (returnIndent > 0) {
                        return (returnIndent - 1);
                    }
                }
                // or a parenthesis
                else {
                    subStruct = std::make_shared<RepliStruct>(Structure);
                    args.push_back(subStruct);
                    returnIndent = subStruct->parse(stream, curIndent, prevIndent);
                    expectSet = false;

                    if (returnIndent < 0) {
                        return -1;
                    }

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }

                    if (returnIndent > 0) {
                        return (returnIndent - 1);
                    }
                }
            } else if (curIndent < prevIndent) {
                if (str.size() > 0) {
                    if ((cmd.size() > 0) || (type == Set)) {
                        subStruct = std::make_shared<RepliStruct>(Atom);
                        subStruct->parent = this;
                        args.push_back(subStruct);
                        subStruct->cmd = str;
                        str = "";

                        if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                            return 0;
                        }
                    } else {
                        cmd = str;
                        str = "";
                    }
                }

                // current structure or set is complete
                return prevIndent - curIndent - 1;
            } else {
                // act as if we met a space
                if (str.size() > 0) {
                    if ((cmd.size() > 0) || (type == Set) || (type == Root)) {
                        subStruct = std::make_shared<RepliStruct>(Atom);
                        subStruct->parent = this;
                        args.push_back(subStruct);
                        subStruct->cmd = str;
                        str = "";

                        if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                            return 0;
                        }
                    } else {
                        cmd = str;
                        str = "";
                    }
                }
            }

            break;

        case ';': // Comments
            while (!stream->eof() && stream->peek() != '\n') {
                stream->get(); // discard
            }

            break;

        case ' ':

            // next string is ready
            if (str.size() > 0) {
                if ((cmd.size() > 0) || (type == Set) || (type == Development)) { // Modification from Eric to have the Development treat tpl vars as atoms instead of a Development.cmd
                    // Check if we need to read more tokens for the string
                    if (str[0] == '"' && str[str.length() - 1] != '"') {
                        str += ' ';

                        while (!stream->eof()) {
                            c = stream->get();
                            str += c;

                            if (c == '"') {
                                break;
                            }
                        }
                    }

                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            break;

        case '(':

            // Check for scenario 'xxx('
            if (str.size() > 0) {
                if (lastc == ':') { // label:(xxx)
                    label = str;
                    str = "";
                } else if ((cmd.size() > 0) || (type == Set)) {
                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            subStruct = std::make_shared<RepliStruct>(Structure);
            subStruct->label = label;
            label = "";
            subStruct->parent = this;
            args.push_back(subStruct);
            returnIndent = subStruct->parse(stream, curIndent, prevIndent);

            if (returnIndent < 0) {
                return -1;
            }

            if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                return 0;
            }

            if (returnIndent > 0) {
                return (returnIndent - 1);
            }

            break;

        case ')':

            // Check for directive use of xxx):xxx or xxx):
            if (stream->peek() == ':') {
                // expect ':' or ':xxx'
                while ((!stream->eof()) && ((c = stream->get()) > 32)) {
                    tail += c;
                }
            }

            // We met a boundary, act as ' '
            if (str.size() > 0) {
                if ((cmd.size() > 0) || (type == Set)) {
                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            return 0;

        case '{':

            // Check for scenario 'xxx{'
            if (str.size() > 0) {
                if (lastc == ':') { // label:{xxx}
                    label = str;
                    str = "";
                } else if ((cmd.size() > 0) || (type == Set)) {
                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            subStruct = std::make_shared<RepliStruct>(Development);
            subStruct->label = label;
            label = "";
            subStruct->parent = this;
            args.push_back(subStruct);
            returnIndent = subStruct->parse(stream, curIndent, prevIndent);

            if (returnIndent < 0) {
                return -1;
            }

            if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                return 0;
            }

            if (returnIndent > 0) {
                return (returnIndent - 1);
            }

            break;

        case '}':

            // Check for directive use of xxx):xxx or xxx):
            if (stream->peek() == ':') {
                // expect ':' or ':xxx'
                while ((!stream->eof()) && ((c = stream->get()) > 32)) {
                    tail += c;
                }
            }

            // We met a boundary, act as ' '
            if (str.size() > 0) {
                if ((cmd.size() > 0) || (type == Set) || (type == Development)) { // Modification from Eric to have the Development treat tpl vars as atoms instead of a Development.cmd
                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            return 0;

        case '|':
            if (stream->peek() == '[') {
                stream->get(); // read the [
                stream->get(); // read the ]
                str += "|[]";
            } else {
                str += c;
            }

            break;

        case '[': // set start
            if (lastc == ':') { // label:[xxx]
                label = str;
                str = "";
            }

            if (stream->peek() == ']') {
                stream->get(); // read the ]

                // if we have a <CR> or <LF> next we may have a line indent set
                if (((tc = stream->peek()) < 32) || (tc == ';')) {
                    expectSet = true;
                } else {
                    // this could be a xxx:[] or xxx[]
                    if ((lastc != ':') && (lastc > 32)) { // label[]
                        // act as if [] is part of the string and continue
                        str += "[]";
                        continue;
                    }

                    // create empty set
                    subStruct = std::make_shared<RepliStruct>(Set);
                    subStruct->parent = this;
                    subStruct->label = label;
                    args.push_back(subStruct);
                }
            } else {
                // Check for scenario 'xxx['
                if (str.size() > 0) {
                    if ((cmd.size() > 0) || (type == Set)) {
                        subStruct = std::make_shared<RepliStruct>(Atom);
                        subStruct->parent = this;
                        args.push_back(subStruct);
                        subStruct->cmd = str;
                        str = "";

                        if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                            return 0;
                        }
                    } else {
                        cmd = str;
                        str = "";
                    }
                }

                subStruct = std::make_shared<RepliStruct>(Set);
                subStruct->parent = this;
                subStruct->label = label;
                label = "";
                args.push_back(subStruct);
                returnIndent = subStruct->parse(stream, curIndent, prevIndent);

                if (returnIndent < 0) {
                    return -1;
                }

                if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                    return 0;
                }

                if (returnIndent > 0) {
                    return (returnIndent - 1);
                }
            }

            break;

        case ']':

            // We met a boundary, act as ' '
            if (str.size() > 0) {
                if ((cmd.size() > 0) || (type == Set)) {
                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            return 0;

        default:
            str += c;
            break;
        }
    }

    return 0;
}